

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O2

void __thiscall QSaveFile::QSaveFile(QSaveFile *this,QString *name,QObject *parent)

{
  QSaveFilePrivate *this_00;
  
  this_00 = (QSaveFilePrivate *)operator_new(0x1e0);
  QSaveFilePrivate::QSaveFilePrivate(this_00);
  QFileDevice::QFileDevice(&this->super_QFileDevice,(QFileDevicePrivate *)this_00,parent);
  (this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&PTR_metaObject_00662108;
  QString::operator=((QString *)
                     &(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d[5].children,
                     name);
  return;
}

Assistant:

QSaveFile::QSaveFile(const QString &name, QObject *parent)
    : QFileDevice(*new QSaveFilePrivate, parent)
{
    Q_D(QSaveFile);
    d->fileName = name;
}